

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trento.cxx
# Opt level: O0

void trento::anon_unknown_0::print_bibtex(void)

{
  std::operator<<((ostream *)&std::cout,
                  "@article{Moreland:2014oya,\n      author         = \"Moreland, J. Scott and Bernhard, Jonah E. and Bass,\n                        Steffen A.\",\n      title          = \"{Alternative ansatz to wounded nucleon and binary\n                        collision scaling in high-energy nuclear collisions}\",\n      journal        = \"Phys.Rev.\",\n      number         = \"1\",\n      volume         = \"C92\",\n      pages          = \"011901\",\n      doi            = \"10.1103/PhysRevC.92.011901\",\n      year           = \"2015\",\n      eprint         = \"1412.4708\",\n      archivePrefix  = \"arXiv\",\n      primaryClass   = \"nucl-th\",\n      SLACcitation   = \"%%CITATION = ARXIV:1412.4708;%%\",\n}\n"
                 );
  return;
}

Assistant:

void print_bibtex() {
  std::cout <<
    "@article{Moreland:2014oya,\n"
    "      author         = \"Moreland, J. Scott and Bernhard, Jonah E. and Bass,\n"
    "                        Steffen A.\",\n"
    "      title          = \"{Alternative ansatz to wounded nucleon and binary\n"
    "                        collision scaling in high-energy nuclear collisions}\",\n"
    "      journal        = \"Phys.Rev.\",\n"
    "      number         = \"1\",\n"
    "      volume         = \"C92\",\n"
    "      pages          = \"011901\",\n"
    "      doi            = \"10.1103/PhysRevC.92.011901\",\n"
    "      year           = \"2015\",\n"
    "      eprint         = \"1412.4708\",\n"
    "      archivePrefix  = \"arXiv\",\n"
    "      primaryClass   = \"nucl-th\",\n"
    "      SLACcitation   = \"%%CITATION = ARXIV:1412.4708;%%\",\n"
    "}\n";
}